

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::getDSAPublicKey(SoftHSM *this,DSAPublicKey *publicKey,Token *token,OSObject *key)

{
  char cVar1;
  int iVar2;
  undefined1 uVar3;
  undefined7 uVar4;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar5;
  ByteString value;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  ByteString local_148;
  ByteString local_120;
  ByteString local_f8;
  ByteString local_d0;
  ByteString local_a8;
  undefined **local_80;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_78;
  undefined **local_58;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_50;
  
  uVar4 = (undefined7)((ulong)key >> 8);
  uVar3 = token == (Token *)0x0 || publicKey == (DSAPublicKey *)0x0;
  if (key == (OSObject *)0x0 || (bool)uVar3) {
    return 7;
  }
  iVar2 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&local_a8);
  ByteString::ByteString(&local_d0);
  ByteString::ByteString(&local_f8);
  ByteString::ByteString(&local_120);
  if ((char)iVar2 == '\0') {
    (*key->_vptr_OSObject[6])(&local_148,key,0x130);
    ByteString::operator=(&local_a8,&local_148);
    local_148._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_148.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_148,key,0x131);
    ByteString::operator=(&local_d0,&local_148);
    local_148._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_148.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_148,key,0x132);
    ByteString::operator=(&local_f8,&local_148);
    local_148._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_148.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_148,key,0x11);
    ByteString::operator=(&local_120,&local_148);
    local_148._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_148.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_148,key,0x130);
    iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_148,(uchar *)&local_a8,
                           (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
    local_148._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_148.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    if ((char)iVar2 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_148,key,0x131);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_148,(uchar *)&local_d0,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_148._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_148.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_58,key,0x132);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_58,(uchar *)&local_f8,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_58 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_50);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_80,key,0x11);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_80,(uchar *)&local_120,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_80 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_78);
    }
    CVar5 = 5;
    if (cVar1 == '\0') goto LAB_00137172;
  }
  (**(code **)(*(long *)publicKey + 0x30))(publicKey,&local_a8);
  (**(code **)(*(long *)publicKey + 0x38))(publicKey,&local_d0);
  (**(code **)(*(long *)publicKey + 0x40))(publicKey,&local_f8);
  (**(code **)(*(long *)publicKey + 0x48))(publicKey,&local_120);
  CVar5 = 0;
LAB_00137172:
  local_120._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_120.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_f8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_f8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_d0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_d0.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_a8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar5;
}

Assistant:

CK_RV SoftHSM::getDSAPublicKey(DSAPublicKey* publicKey, Token* token, OSObject* key)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// DSA Public Key Attributes
	ByteString prime;
	ByteString subprime;
	ByteString generator;
	ByteString value;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME), prime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_SUBPRIME), subprime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_BASE), generator);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_VALUE), value);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		prime = key->getByteStringValue(CKA_PRIME);
		subprime = key->getByteStringValue(CKA_SUBPRIME);
		generator = key->getByteStringValue(CKA_BASE);
		value = key->getByteStringValue(CKA_VALUE);
	}

	publicKey->setP(prime);
	publicKey->setQ(subprime);
	publicKey->setG(generator);
	publicKey->setY(value);

	return CKR_OK;
}